

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<SafeSymbols>::moveAppend
          (QGenericArrayOps<SafeSymbols> *this,SafeSymbols *b,SafeSymbols *e)

{
  SafeSymbols *this_00;
  ulong in_RDX;
  ulong in_RSI;
  SafeSymbols *in_RDI;
  SafeSymbols *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<SafeSymbols>::begin((QArrayDataPointer<SafeSymbols> *)0x16fd67);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      SafeSymbols::SafeSymbols(this_00,in_RDI);
      local_10 = local_10 + 0x40;
      (in_RDI->symbols).d.size = (in_RDI->symbols).d.size + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }